

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O0

void __thiscall MeshLib::Solid::add(Solid *this,Solid *solid)

{
  double dVar1;
  bool bVar2;
  Vertex *this_00;
  Point *pPVar3;
  Point *pPVar4;
  bool *pbVar5;
  Face *this_01;
  HalfEdge **ppHVar6;
  Vertex **ppVVar7;
  int *piVar8;
  tFace this_02;
  string *psVar9;
  string *psVar10;
  Face *F;
  int i;
  int v_1 [3];
  HalfEdge *he;
  Face *f;
  TreeIterator<MeshLib::Face> fiter;
  Vertex *w;
  Vertex *v;
  undefined1 local_130 [8];
  TreeIterator<MeshLib::Vertex> viter;
  Solid *solid_local;
  Solid *this_local;
  
  viter.m_root = (Node<MeshLib::Vertex> *)solid;
  AVL::TreeIterator<MeshLib::Vertex>::TreeIterator
            ((TreeIterator<MeshLib::Vertex> *)local_130,&solid->m_verts);
  while( true ) {
    bVar2 = AVL::TreeIterator<MeshLib::Vertex>::end((TreeIterator<MeshLib::Vertex> *)local_130);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    this_00 = AVL::TreeIterator<MeshLib::Vertex>::operator*
                        ((TreeIterator<MeshLib::Vertex> *)local_130);
    piVar8 = Vertex::id(this_00);
    fiter.m_root = (Node<MeshLib::Face> *)createVertex(this,*piVar8);
    pPVar3 = Vertex::point(this_00);
    pPVar4 = Vertex::point((Vertex *)fiter.m_root);
    pPVar4->v[2] = pPVar3->v[2];
    dVar1 = pPVar3->v[1];
    pPVar4->v[0] = pPVar3->v[0];
    pPVar4->v[1] = dVar1;
    psVar9 = Vertex::string_abi_cxx11_(this_00);
    psVar10 = Vertex::string_abi_cxx11_((Vertex *)fiter.m_root);
    std::__cxx11::string::operator=((string *)psVar10,(string *)psVar9);
    pbVar5 = Vertex::boundary(this_00);
    bVar2 = *pbVar5;
    pbVar5 = Vertex::boundary((Vertex *)fiter.m_root);
    *pbVar5 = (bool)(bVar2 & 1);
    AVL::TreeIterator<MeshLib::Vertex>::operator++((TreeIterator<MeshLib::Vertex> *)local_130);
  }
  AVL::TreeIterator<MeshLib::Vertex>::~TreeIterator((TreeIterator<MeshLib::Vertex> *)local_130);
  AVL::TreeIterator<MeshLib::Face>::TreeIterator
            ((TreeIterator<MeshLib::Face> *)&f,(Tree<MeshLib::Face> *)&viter.m_root[1].left);
  while( true ) {
    bVar2 = AVL::TreeIterator<MeshLib::Face>::end((TreeIterator<MeshLib::Face> *)&f);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    this_01 = AVL::TreeIterator<MeshLib::Face>::operator*((TreeIterator<MeshLib::Face> *)&f);
    ppHVar6 = Face::halfedge(this_01);
    v_1._4_8_ = *ppHVar6;
    for (F._0_4_ = 0; (int)F < 3; F._0_4_ = (int)F + 1) {
      ppVVar7 = HalfEdge::vertex((HalfEdge *)v_1._4_8_);
      piVar8 = Vertex::id(*ppVVar7);
      *(int *)((long)&F + (long)(int)F * 4 + 4) = *piVar8;
      ppHVar6 = HalfEdge::he_next((HalfEdge *)v_1._4_8_);
      v_1._4_8_ = *ppHVar6;
    }
    piVar8 = Face::id(this_01);
    this_02 = createFace(this,(int *)((long)&F + 4),*piVar8);
    psVar9 = Face::string_abi_cxx11_(this_01);
    psVar10 = Face::string_abi_cxx11_(this_02);
    std::__cxx11::string::operator=((string *)psVar10,(string *)psVar9);
    AVL::TreeIterator<MeshLib::Face>::operator++((TreeIterator<MeshLib::Face> *)&f);
  }
  AVL::TreeIterator<MeshLib::Face>::~TreeIterator((TreeIterator<MeshLib::Face> *)&f);
  labelBoundaryEdges(this);
  return;
}

Assistant:

void Solid::add( Solid & solid )
{	
	for(AVL::TreeIterator<Vertex> viter(solid.m_verts); !viter.end(); ++viter)
	{
		Vertex * v = *viter;
		Vertex * w = createVertex( v->id() );

		w->point() = v->point();
		w->string()= v->string();
		w->boundary() = v->boundary();
	}

	for(AVL::TreeIterator<Face> fiter(solid.m_faces); !fiter.end(); ++fiter)
	{
		Face * f = *fiter;

		HalfEdge * he = f->halfedge();
		int v[3];

		for( int i = 0; i < 3; i ++ )
		{
			v[i] = he->vertex()->id();
			he = he->he_next();
		}

		Face * F = createFace(v, f->id() );
		F->string() = f->string();
	}

	labelBoundaryEdges();

}